

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O1

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  pointer *ppcVar1;
  mapped_type pgVar2;
  void *pvVar3;
  void *__src;
  FILE *__stream;
  _Alloc_hider _Var4;
  key_type kVar5;
  int32_t *piVar6;
  gpt2_model *pgVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  value_type *__val;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ggml_context *pgVar17;
  ggml_tensor *pgVar18;
  mapped_type *ppgVar19;
  long *plVar20;
  undefined8 *puVar21;
  iterator iVar22;
  ulong uVar23;
  size_t __n;
  undefined8 uVar24;
  string *psVar25;
  long *plVar26;
  size_type *psVar27;
  undefined8 *puVar28;
  ulong *puVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  vector<char,_std::allocator<char>_> *pvVar33;
  undefined4 uVar34;
  long lVar35;
  int iVar36;
  uint uVar37;
  string *psVar38;
  bool bVar39;
  pointer pgVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint32_t magic;
  vector<char,_std::allocator<char>_> buf;
  int32_t n_vocab;
  int32_t length;
  uint32_t len;
  gpt2_hparams *hparams;
  size_t total_size;
  ifstream fin;
  undefined8 uVar44;
  key_type local_348;
  vector<char,_std::allocator<char>_> local_328;
  long lStack_310;
  undefined8 local_308;
  long local_2f8 [2];
  gpt_vocab *local_2e8;
  key_type local_2dc;
  int32_t *local_2d8;
  uint local_2cc;
  gpt2_model *local_2c8;
  string *local_2c0;
  long local_2b8;
  _Base_ptr local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  undefined8 uStack_248;
  undefined1 local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2e8 = vocab;
  local_2c8 = model;
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",(fname->_M_dataplus)._M_p);
  local_2c0 = fname;
  std::ifstream::ifstream(local_238,(string *)fname,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_238,(long)&local_348);
    pgVar7 = local_2c8;
    if ((int)local_348._M_dataplus._M_p != 0x67676d6c) {
      bVar39 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",
              (local_2c0->_M_dataplus)._M_p);
      goto LAB_001097c4;
    }
    std::istream::read((char *)local_238,(long)local_2c8);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_ctx);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_embd);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_head);
    std::istream::read((char *)local_238,(long)&(pgVar7->hparams).n_layer);
    local_2d8 = &(pgVar7->hparams).ftype;
    std::istream::read((char *)local_238,(long)local_2d8);
    iVar9 = (pgVar7->hparams).ftype;
    printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_vocab);
    printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_ctx);
    printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_embd);
    printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_head);
    printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).n_layer);
    printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)(uint)(pgVar7->hparams).ftype);
    printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)(uint)(iVar9 / 1000));
    (pgVar7->hparams).ftype = (pgVar7->hparams).ftype % 1000;
    local_308 = (long *)((ulong)local_308._4_4_ << 0x20);
    std::istream::read((char *)local_238,(long)&local_308);
    uVar37 = (uint)local_308;
    uVar30 = (pgVar7->hparams).n_vocab;
    if ((uint)local_308 == uVar30) {
      local_2b8 = CONCAT44(local_2b8._4_4_,uVar30);
      local_2b0 = (_Base_ptr)CONCAT44(local_2b0._4_4_,(uint)local_308);
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity =
           local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x80);
      local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start + 0x80);
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x70) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x78) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x60) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x68) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x50) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x58) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x40) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x48) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x30) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x38) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x10) = 0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x18) = 0;
      *(pointer *)
       local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = (pointer)0x0;
      *(undefined8 *)
       ((long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 8) = 0;
      local_2dc = 0;
      local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      if (0 < (int)(uint)local_308) {
        this = &local_2e8->id_to_token;
        do {
          std::istream::read((char *)local_238,(long)&local_2cc);
          std::vector<char,_std::allocator<char>_>::resize(&local_328,(ulong)local_2cc);
          std::istream::read((char *)local_238,
                             (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_start);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_348,0,(char *)local_348._M_string_length,
                     (ulong)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
          kVar5 = local_2dc;
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&local_2e8->token_to_id,&local_348);
          *pmVar11 = kVar5;
          pmVar12 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this,&local_2dc);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          local_2dc = local_2dc + 1;
        } while (local_2dc < (int)(uint)local_308);
      }
      if ((pointer *)
          local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar37 = (uint)local_2b0;
      uVar30 = (uint)local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load",
              (local_2c0->_M_dataplus)._M_p,(ulong)local_308 & 0xffffffff,(ulong)uVar30);
    }
    if (uVar37 == uVar30) {
      iVar9 = ggml_ftype_to_ggml_type(*local_2d8);
      if (iVar9 == 0x27) {
        bVar39 = false;
        fprintf(_stderr,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                (local_2c0->_M_dataplus)._M_p,(ulong)(uint)*local_2d8);
        goto LAB_001097c4;
      }
      local_2d8 = (int32_t *)CONCAT44(local_2d8._4_4_,iVar9);
      iVar9 = (local_2c8->hparams).n_embd;
      lVar35 = (long)iVar9;
      local_2b0 = (_Base_ptr)(long)(local_2c8->hparams).n_layer;
      local_2e8 = (gpt_vocab *)(long)(local_2c8->hparams).n_ctx;
      iVar36 = (local_2c8->hparams).n_vocab;
      local_2b8 = ggml_row_size(0,lVar35);
      local_2c0 = (string *)ggml_row_size(0,lVar35);
      lVar31 = iVar36 * lVar35;
      lVar13 = ggml_row_size((ulong)local_2d8 & 0xffffffff,lVar31);
      local_2a8 = ggml_row_size(0,(long)local_2e8 * lVar35);
      local_258 = ggml_row_size((ulong)local_2d8 & 0xffffffff,lVar31);
      local_260 = ggml_row_size(0,lVar35);
      local_268 = ggml_row_size(0,lVar35);
      lVar31 = ggml_row_size(0,lVar35);
      local_270 = ggml_row_size(0,lVar35);
      local_278 = ggml_row_size((ulong)local_2d8 & 0xffffffff,(long)((int)(lVar35 * 3) * iVar9));
      local_280 = ggml_row_size(0,lVar35 * 3);
      local_288 = ggml_row_size((ulong)local_2d8 & 0xffffffff,iVar9 * iVar9);
      local_290 = ggml_row_size(0,lVar35);
      iVar36 = iVar9 * 4;
      lVar14 = ggml_row_size((ulong)local_2d8 & 0xffffffff,(long)(iVar36 * iVar9));
      local_298 = ggml_row_size(0,(long)iVar36);
      lVar15 = ggml_row_size((ulong)local_2d8 & 0xffffffff,(long)(iVar36 * iVar9));
      local_2a0 = ggml_row_size(0,(long)iVar36);
      lVar16 = ggml_row_size(0,lVar35);
      lVar35 = ggml_row_size(0,lVar35);
      lVar13 = (long)&(local_2c0->_M_dataplus)._M_p +
               (lVar15 + local_2a0 +
               lVar14 + local_298 +
               lVar31 + local_270 + local_268 + local_260 + local_280 + local_288 + local_290 +
               local_278) * (long)local_2b0 +
               (lVar35 + lVar16) * (long)local_2e8 * (long)local_2b0 +
               local_258 + lVar13 + local_2a8 + ((int)local_2b0 * 0x1800 + 0xc00) + local_2b8;
      printf("%s: ggml tensor size = %d bytes\n","gpt2_model_load",0x150);
      auVar41._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar41._0_8_ = lVar13;
      auVar41._12_4_ = 0x45300000;
      printf("%s: ggml ctx size = %6.2f MB\n",
             ((auVar41._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) * 9.5367431640625e-07,
             "gpt2_model_load");
      uStack_248 = 0;
      local_240 = 0;
      uVar44 = 0;
      local_250 = lVar13;
      pgVar17 = (ggml_context *)ggml_init();
      pgVar7 = local_2c8;
      piVar6 = local_2d8;
      local_2c8->ctx_w = pgVar17;
      uVar34 = local_2d8._0_4_;
      if (pgVar17 == (ggml_context *)0x0) {
        gpt2_model_load();
      }
      else {
        lVar14 = (long)(local_2c8->hparams).n_embd;
        local_2c0 = (string *)(long)(local_2c8->hparams).n_layer;
        iVar9 = (local_2c8->hparams).n_ctx;
        lVar31 = (long)(local_2c8->hparams).n_vocab;
        std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                  (&local_2c8->layers,(size_type)local_2c0);
        pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar14);
        pgVar7->ln_f_g = pgVar18;
        pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar14);
        pgVar7->ln_f_b = pgVar18;
        pgVar18 = (ggml_tensor *)
                  ggml_new_tensor_2d(pgVar7->ctx_w,(ulong)piVar6 & 0xffffffff,lVar14,lVar31);
        pgVar7->wte = pgVar18;
        pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,0,lVar14,(long)iVar9);
        pgVar7->wpe = pgVar18;
        pgVar18 = (ggml_tensor *)
                  ggml_new_tensor_2d(pgVar7->ctx_w,(ulong)piVar6 & 0xffffffff,lVar14,lVar31);
        pgVar7->lm_head = pgVar18;
        pgVar2 = pgVar7->ln_f_g;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/ln_f/g","");
        local_2e8 = (gpt_vocab *)&pgVar7->tensors;
        ppgVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                 *)local_2e8,&local_348);
        *ppgVar19 = pgVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        pgVar2 = local_2c8->ln_f_b;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/ln_f/b","");
        ppgVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                 *)local_2e8,&local_348);
        *ppgVar19 = pgVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        pgVar2 = local_2c8->wte;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/wte","");
        ppgVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                 *)local_2e8,&local_348);
        *ppgVar19 = pgVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        pgVar2 = local_2c8->wpe;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/wpe","");
        ppgVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                 *)local_2e8,&local_348);
        *ppgVar19 = pgVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        pgVar2 = local_2c8->lm_head;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"model/lm_head","");
        ppgVar19 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                 *)local_2e8,&local_348);
        *ppgVar19 = pgVar2;
        local_2a8 = lVar14;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if (0 < (int)local_2c0) {
          local_2b8 = local_2a8 * 3;
          local_2b0 = (_Base_ptr)(long)((int)local_2a8 * 4);
          psVar38 = (string *)0x0;
          do {
            lVar31 = local_2a8;
            pgVar7 = local_2c8;
            pgVar40 = (local_2c8->layers).
                      super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)psVar38;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(local_2c8->ctx_w,0,local_2a8);
            pgVar40->ln_1_g = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar31);
            pgVar40->ln_1_b = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar31);
            pgVar40->ln_2_g = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar31);
            pgVar40->ln_2_b = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar34,lVar31,local_2b8);
            pgVar40->c_attn_attn_w = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,local_2b8);
            pgVar40->c_attn_attn_b = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar34,lVar31,lVar31);
            pgVar40->c_attn_proj_w = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar31);
            pgVar40->c_attn_proj_b = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar34,lVar31,local_2b0);
            pgVar40->c_mlp_fc_w = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,local_2b0);
            pgVar40->c_mlp_fc_b = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7->ctx_w,uVar34,local_2b0,lVar31);
            pgVar40->c_mlp_proj_w = pgVar18;
            pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar31);
            pgVar40->c_mlp_proj_b = pgVar18;
            uVar30 = 1;
            ppcVar1 = &local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            uVar37 = (uint)psVar38;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00108022;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00108022;
                }
                if (uVar10 < 10000) goto LAB_00108022;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00108022:
            pgVar2 = pgVar40->ln_1_g;
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->ln_1_b;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_001081bd;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_001081bd;
                }
                if (uVar10 < 10000) goto LAB_001081bd;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_001081bd:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->ln_2_g;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00108355;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00108355;
                }
                if (uVar10 < 10000) goto LAB_00108355;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00108355:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->ln_2_b;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_001084ed;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_001084ed;
                }
                if (uVar10 < 10000) goto LAB_001084ed;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_001084ed:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_attn_attn_w;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00108685;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00108685;
                }
                if (uVar10 < 10000) goto LAB_00108685;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00108685:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_attn_attn_b;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0010881d;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0010881d;
                }
                if (uVar10 < 10000) goto LAB_0010881d;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_0010881d:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_attn_proj_w;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_001089b5;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_001089b5;
                }
                if (uVar10 < 10000) goto LAB_001089b5;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_001089b5:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_attn_proj_b;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00108b4d;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00108b4d;
                }
                if (uVar10 < 10000) goto LAB_00108b4d;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00108b4d:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_mlp_fc_w;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00108ce5;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00108ce5;
                }
                if (uVar10 < 10000) goto LAB_00108ce5;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00108ce5:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_mlp_fc_b;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00108e7d;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00108e7d;
                }
                if (uVar10 < 10000) goto LAB_00108e7d;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00108e7d:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_mlp_proj_w;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00109015;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00109015;
                }
                if (uVar10 < 10000) goto LAB_00109015;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_00109015:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            plVar20 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x1202dd);
            plVar26 = plVar20 + 2;
            if ((pointer *)*plVar20 == (pointer *)plVar26) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              lStack_310 = plVar20[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*plVar26;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*plVar20;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar20[1];
            *plVar20 = (long)plVar26;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            psVar27 = (size_type *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar27) {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *psVar27;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)psVar27;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            uVar34 = local_2d8._0_4_;
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            pgVar2 = pgVar40->c_mlp_proj_b;
            uVar30 = 1;
            if ((string *)0x9 < psVar38) {
              uVar8 = 4;
              psVar25 = psVar38;
              do {
                uVar30 = uVar8;
                uVar10 = (uint)psVar25;
                if (uVar10 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_001091b5;
                }
                if (uVar10 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_001091b5;
                }
                if (uVar10 < 10000) goto LAB_001091b5;
                psVar25 = (string *)(((ulong)psVar25 & 0xffffffff) / 10000);
                uVar8 = uVar30 + 4;
              } while (99999 < uVar10);
              uVar30 = uVar30 + 1;
            }
LAB_001091b5:
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar30);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_308,uVar30,uVar37);
            puVar21 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x1202dd);
            puVar28 = puVar21 + 2;
            if ((pointer *)*puVar21 == (pointer *)puVar28) {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*puVar28;
              lStack_310 = puVar21[3];
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppcVar1;
            }
            else {
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)*puVar28;
              local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*puVar21;
            }
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)puVar21[1];
            *puVar21 = puVar28;
            puVar21[1] = 0;
            *(undefined1 *)(puVar21 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_328);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            puVar29 = (ulong *)(plVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar29) {
              local_348.field_2._M_allocated_capacity = *puVar29;
              local_348.field_2._8_8_ = plVar20[3];
            }
            else {
              local_348.field_2._M_allocated_capacity = *puVar29;
              local_348._M_dataplus._M_p = (pointer)*plVar20;
            }
            local_348._M_string_length = plVar20[1];
            *plVar20 = (long)puVar29;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            ppgVar19 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_2e8,&local_348);
            *ppgVar19 = pgVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer *)
                local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != ppcVar1) {
              operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (ulong)(local_328.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
            }
            if (local_308 != local_2f8) {
              operator_delete(local_308,local_2f8[0] + 1);
            }
            psVar38 = (string *)((long)&(psVar38->_M_dataplus)._M_p + 1);
          } while (psVar38 != local_2c0);
        }
        pgVar7 = local_2c8;
        uVar32 = (long)(local_2c8->hparams).n_ctx * (long)(local_2c8->hparams).n_layer;
        lVar31 = (long)(local_2c8->hparams).n_embd * uVar32;
        pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(local_2c8->ctx_w,0,lVar31);
        pgVar7->memory_k = pgVar18;
        pgVar18 = (ggml_tensor *)ggml_new_tensor_1d(pgVar7->ctx_w,0,lVar31);
        pgVar7->memory_v = pgVar18;
        lVar31 = ggml_nbytes(pgVar7->memory_k);
        lVar14 = ggml_nbytes(pgVar7->memory_v);
        lVar14 = lVar14 + lVar31;
        auVar42._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar42._0_8_ = lVar14;
        auVar42._12_4_ = 0x45300000;
        printf("%s: memory size = %8.2f MB, n_mem = %d\n",
               ((auVar42._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 0.0009765625 *
               0.0009765625,"gpt2_model_load",uVar32 & 0xffffffff);
        local_2b0 = &(pgVar7->tensors)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_2b8 = 0;
        bVar39 = false;
        do {
          std::istream::read((char *)local_238,(long)&local_308);
          std::istream::read((char *)local_238,(long)&local_2dc);
          std::istream::read((char *)local_238,(long)&local_2cc);
          iVar9 = 9;
          if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
            local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x100000001;
            if ((int)(uint)local_308 < 1) {
              lVar31 = 1;
            }
            else {
              lVar31 = 1;
              pvVar33 = &local_328;
              lVar14 = 0;
              do {
                std::istream::read((char *)local_238,(long)pvVar33);
                lVar31 = (long)(int)lVar31 *
                         (long)*(int *)&(pvVar33->super__Vector_base<char,_std::allocator<char>_>).
                                        _M_impl.super__Vector_impl_data._M_start;
                lVar14 = lVar14 + 1;
                pvVar33 = (vector<char,_std::allocator<char>_> *)
                          ((long)&(pvVar33->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                                  .super__Vector_impl_data._M_start + 4);
              } while (lVar14 < (int)(uint)local_308);
            }
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_348,(char)local_2dc);
            std::istream::read((char *)local_238,(long)local_348._M_dataplus._M_p);
            iVar22 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                             *)local_2e8,&local_348);
            if (iVar22._M_node == local_2b0) {
              gpt2_model_load();
LAB_00109680:
              iVar9 = 1;
            }
            else {
              ppgVar19 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_2e8,&local_348);
              pgVar2 = *ppgVar19;
              lVar14 = ggml_nelements(pgVar2);
              if (lVar14 != lVar31) {
                gpt2_model_load();
                goto LAB_00109680;
              }
              if ((pgVar2->ne[0] !=
                   (long)(int)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start) ||
                 (pgVar2->ne[1] !=
                  (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_)) {
                uVar44 = CONCAT44((int)((ulong)uVar44 >> 0x20),
                                  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_);
                lVar13 = CONCAT44((int)((ulong)lVar13 >> 0x20),
                                  (int)local_328.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
                fprintf(_stderr,
                        "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                        ,"gpt2_model_load",local_348._M_dataplus._M_p,pgVar2->ne[0],
                        (ulong)(uint)pgVar2->ne[1],lVar13,uVar44);
                goto LAB_00109680;
              }
              lVar14 = ggml_type_size(local_2cc);
              uVar32 = ggml_blck_size(pgVar2->type);
              uVar23 = ggml_nbytes(pgVar2);
              _Var4._M_p = local_348._M_dataplus._M_p;
              __stream = _stderr;
              if ((ulong)(lVar14 * lVar31) / uVar32 != uVar23) {
                uVar24 = ggml_nbytes(pgVar2);
                fprintf(__stream,
                        "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                        "gpt2_model_load",_Var4._M_p,uVar24,lVar14 * lVar31);
                goto LAB_00109680;
              }
              pvVar3 = pgVar2->data;
              ggml_nbytes(pgVar2);
              std::istream::read((char *)local_238,(long)pvVar3);
              iVar9 = std::__cxx11::string::compare((char *)&local_348);
              if ((iVar9 == 0) && (!bVar39)) {
                pvVar3 = local_2c8->lm_head->data;
                __src = pgVar2->data;
                __n = ggml_nbytes(pgVar2);
                memcpy(pvVar3,__src,__n);
              }
              iVar9 = std::__cxx11::string::compare((char *)&local_348);
              lVar31 = ggml_nbytes(pgVar2);
              if (iVar9 == 0) {
                bVar39 = true;
              }
              local_2b8 = local_2b8 + lVar31;
              iVar9 = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
          }
        } while (iVar9 == 0);
        if (iVar9 == 9) {
          auVar43._0_8_ = (double)CONCAT44(0x43300000,(int)local_2b8);
          auVar43._8_4_ = (int)((ulong)local_2b8 >> 0x20);
          auVar43._12_4_ = 0x45300000;
          bVar39 = true;
          printf("%s: model size  = %8.2f MB\n",
                 ((auVar43._8_8_ - 1.9342813113834067e+25) + (auVar43._0_8_ - 4503599627370496.0)) *
                 0.0009765625 * 0.0009765625,"gpt2_model_load");
          std::ifstream::close();
          goto LAB_001097c4;
        }
      }
    }
  }
  else {
    gpt2_model_load();
  }
  bVar39 = false;
LAB_001097c4:
  std::ifstream::~ifstream(local_238);
  return bVar39;
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        ctx_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        ctx_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        ctx_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_k
        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_v

        ctx_size += (6 + 12*n_layer)*512; // object overhead

        printf("%s: ggml tensor size = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ false,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                memcpy(model.lm_head->data, tensor->data, ggml_nbytes(tensor));
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}